

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalNinjaGenerator::ComputeTargetObjectDirectory
          (cmGlobalNinjaGenerator *this,cmGeneratorTarget *gt)

{
  cmTarget *pcVar1;
  string dir;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  string local_30 [32];
  
  pcVar1 = gt->Target;
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  cmMakefile::GetCurrentBinaryDirectory(gt->Makefile);
  std::__cxx11::string::append((char *)&local_50);
  std::__cxx11::string::append((char *)&local_50);
  (*gt->LocalGenerator->_vptr_cmLocalGenerator[0xc])(local_30,gt->LocalGenerator,pcVar1);
  std::__cxx11::string::append((string *)&local_50);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::append((char *)&local_50);
  std::__cxx11::string::_M_assign((string *)&gt->ObjectDirectory);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void cmGlobalNinjaGenerator
::ComputeTargetObjectDirectory(cmGeneratorTarget* gt) const
{
  cmTarget* target = gt->Target;

  // Compute full path to object file directory for this target.
  std::string dir;
  dir += gt->Makefile->GetCurrentBinaryDirectory();
  dir += "/";
  dir += gt->LocalGenerator->GetTargetDirectory(*target);
  dir += "/";
  gt->ObjectDirectory = dir;
}